

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_access_idx(Integer g_a,Integer *lo,Integer *hi,AccessIndex *index,Integer *ld)

{
  long lVar1;
  C_Integer *pCVar2;
  global_array_t *pgVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  logical lVar8;
  size_t sVar9;
  Integer IVar10;
  long lVar11;
  ulong uVar12;
  C_Integer CVar13;
  char *pcVar14;
  long lVar15;
  ushort uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long *plVar21;
  long lVar22;
  Integer *pIVar23;
  Integer ow;
  Integer _hi [7];
  Integer _lo [7];
  char err_string [256];
  long local_208;
  long local_200;
  Integer *local_1f8;
  long local_1f0;
  Integer local_1e8;
  long local_1e0;
  long *local_1d8;
  long *local_1d0;
  Integer *local_1c8;
  long local_1c0;
  long local_1b8 [7];
  long alStack_180 [9];
  int local_138 [3];
  undefined1 uStack_129;
  undefined7 uStack_128;
  
  local_200 = g_a * 0x368;
  iVar7 = GA[g_a + 1000].p_handle;
  lVar22 = (long)iVar7;
  local_1f8 = hi;
  local_1e8 = g_a;
  local_1d8 = index;
  lVar8 = pnga_locate(g_a,lo,&local_208);
  if (lVar8 == 0) {
    pnga_error("locate top failed",0);
  }
  if (iVar7 != -1) {
    local_208 = (long)PGRP_LIST[lVar22].inv_map_proc_list[local_208];
  }
  iVar5 = armci_domain_id(0,(int)local_208);
  iVar6 = armci_domain_my_id(0);
  if ((iVar5 != iVar6) && (local_208 != CONCAT44(GAme._4_4_,(uint)GAme))) {
    pnga_error("cannot access top of the patch",local_208);
  }
  lVar8 = pnga_locate(local_1e8,local_1f8,&local_208);
  if (lVar8 == 0) {
    pnga_error("locate bottom failed",0);
  }
  if (iVar7 != -1) {
    local_208 = (long)PGRP_LIST[lVar22].inv_map_proc_list[local_208];
  }
  lVar1 = local_1e8 + 1000;
  local_1c0 = lVar22;
  iVar7 = armci_domain_id(0,(int)local_208);
  iVar5 = armci_domain_my_id(0);
  if ((iVar7 != iVar5) && (local_208 != CONCAT44(GAme._4_4_,(uint)GAme))) {
    pnga_error("cannot access bottom of the patch",local_208);
  }
  uVar16 = GA[lVar1].ndim;
  lVar22 = (long)(short)uVar16;
  local_1e0 = lVar1;
  local_1d0 = ld;
  if (0 < lVar22) {
    lVar11 = 0;
    pIVar23 = local_1f8;
    local_1c8 = lo;
    do {
      if (pIVar23[lVar11] < lo[lVar11]) {
        local_138._0_8_ = 0x6c20746f6e6e6163;
        stack0xfffffffffffffed0 = 0x7220657461636f;
        uStack_129 = 0x65;
        uStack_128 = 0x203a6e6f6967;
        local_1f0 = lVar11;
        strcpy((char *)((long)&uStack_128 + 6),GA[lVar1].name);
        sVar9 = strlen((char *)local_138);
        sprintf((char *)((long)local_138 + (long)(int)sVar9)," [%ld:%ld ",*lo,*pIVar23);
        sVar9 = strlen((char *)local_138);
        pIVar23 = local_1f8;
        iVar7 = (int)sVar9;
        if (1 < GA[lVar1].ndim) {
          lVar22 = 1;
          do {
            sprintf((char *)((long)local_138 + (long)(int)sVar9),",%ld:%ld ",local_1c8[lVar22],
                    pIVar23[lVar22]);
            sVar9 = strlen((char *)local_138);
            iVar7 = (int)sVar9;
            lVar22 = lVar22 + 1;
          } while (lVar22 < GA[lVar1].ndim);
        }
        *(undefined2 *)((long)local_138 + (long)iVar7) = 0x5d;
        pnga_error((char *)local_138,local_1e8);
        lVar11 = local_1f0;
        lo = local_1c8;
      }
      lVar11 = lVar11 + 1;
      uVar16 = GA[lVar1].ndim;
      lVar22 = (long)(short)uVar16;
    } while (lVar11 < lVar22);
  }
  plVar21 = local_1d0;
  if ((int)local_1c0 != -1) {
    local_208 = (long)PGRP_LIST[local_1c0].map_proc_list[local_208];
  }
  iVar7 = GA[lVar1].distr_type;
  if (iVar7 - 1U < 3) {
    uVar12 = (long)(int)local_208 % GA[lVar1].num_blocks[0];
    local_138[0] = (int)uVar12;
    if (1 < (short)uVar16) {
      uVar12 = uVar12 & 0xffffffff;
      lVar20 = 0;
      lVar11 = local_208;
      do {
        lVar11 = (long)((int)lVar11 - (int)uVar12) /
                 *(long *)((long)GA[1000].num_blocks + lVar20 * 8 + local_200);
        uVar12 = (long)(int)lVar11 %
                 *(long *)((long)GA[1000].num_blocks + lVar20 * 8 + local_200 + 8);
        local_138[lVar20 + 1] = (int)uVar12;
        lVar20 = lVar20 + 1;
      } while ((ulong)(uint)(int)(short)uVar16 - 1 != lVar20);
    }
    if (0 < (short)uVar16) {
      lVar11 = 0;
      do {
        iVar7 = *(int *)((long)local_138 + lVar11);
        lVar20 = *(long *)((long)GA[1000].block_dims + lVar11 * 2 + local_200);
        *(long *)((long)alStack_180 + lVar11 * 2 + 8U) = lVar20 * iVar7 + 1;
        lVar20 = ((long)iVar7 + 1) * lVar20;
        *(long *)((long)local_1b8 + lVar11 * 2) = lVar20;
        lVar15 = *(long *)((long)GA[1000].dims + lVar11 * 2 + local_200);
        if (lVar15 <= lVar20) {
          lVar20 = lVar15;
        }
        *(long *)((long)local_1b8 + lVar11 * 2) = lVar20;
        lVar11 = lVar11 + 4;
      } while ((ulong)(uint)(int)(short)uVar16 << 2 != lVar11);
    }
    goto LAB_0017020a;
  }
  if (iVar7 == 4) {
    uVar12 = (long)(int)local_208 % GA[lVar1].num_blocks[0];
    local_138[0] = (int)uVar12;
    if (1 < (short)uVar16) {
      uVar12 = uVar12 & 0xffffffff;
      lVar20 = 0;
      lVar11 = local_208;
      do {
        lVar11 = (long)((int)lVar11 - (int)uVar12) /
                 *(long *)((long)GA[1000].num_blocks + lVar20 * 8 + local_200);
        uVar12 = (long)(int)lVar11 %
                 *(long *)((long)GA[1000].num_blocks + lVar20 * 8 + local_200 + 8);
        local_138[lVar20 + 1] = (int)uVar12;
        lVar20 = lVar20 + 1;
      } while ((ulong)(uint)(int)(short)uVar16 - 1 != lVar20);
    }
    if (0 < (short)uVar16) {
      pCVar2 = GA[lVar1].mapc;
      lVar11 = 0;
      iVar7 = 0;
      do {
        iVar5 = *(int *)((long)local_138 + lVar11);
        lVar20 = (long)iVar7 + (long)iVar5;
        *(C_Integer *)((long)alStack_180 + lVar11 * 2 + 8U) = pCVar2[lVar20];
        if ((long)iVar5 < *(long *)((long)GA[lVar1].num_blocks + lVar11 * 2) + -1) {
          lVar20 = GA[lVar1].mapc[lVar20 + 1] + -1;
        }
        else {
          lVar20 = *(long *)((long)GA[lVar1].dims + lVar11 * 2);
        }
        *(long *)((long)local_1b8 + lVar11 * 2) = lVar20;
        iVar7 = iVar7 + *(int *)((long)GA[1000].num_blocks + lVar11 * 2 + local_200);
        lVar11 = lVar11 + 4;
      } while ((ulong)(uint)(int)(short)uVar16 << 2 != lVar11);
    }
    goto LAB_0017020a;
  }
  if (iVar7 != 0) goto LAB_0017020a;
  if (GA[lVar1].num_rstrctd == 0) {
    if (lVar22 < 1) {
      lVar11 = 1;
    }
    else {
      lVar11 = 1;
      lVar20 = 0;
      do {
        lVar11 = lVar11 * *(int *)((long)GA[1000].nblock + lVar20 * 4 + local_200);
        lVar20 = lVar20 + 1;
      } while (lVar22 != lVar20);
    }
    if (-1 < local_208 && local_208 < lVar11) {
      if (0 < lVar22) {
        pCVar2 = GA[lVar1].mapc;
        lVar20 = 0;
        lVar15 = 0;
        lVar11 = local_208;
        do {
          lVar18 = (long)GA[lVar1].nblock[lVar15];
          lVar19 = lVar11 % lVar18;
          alStack_180[lVar15 + 1] = pCVar2[lVar19 + lVar20];
          if (lVar19 == lVar18 + -1) {
            CVar13 = GA[lVar1].dims[lVar15];
          }
          else {
            CVar13 = pCVar2[lVar19 + lVar20 + 1] + -1;
          }
          lVar20 = lVar20 + lVar18;
          local_1b8[lVar15] = CVar13;
          lVar15 = lVar15 + 1;
          lVar11 = lVar11 / lVar18;
        } while (lVar22 != lVar15);
      }
      goto LAB_0017020a;
    }
LAB_001701d9:
    if (lVar22 < 1) goto LAB_0017020a;
    sVar9 = lVar22 * 8;
  }
  else {
    if (local_208 < GA[lVar1].num_rstrctd) {
      if (lVar22 < 1) {
        lVar11 = 1;
      }
      else {
        lVar11 = 1;
        lVar20 = 0;
        do {
          lVar11 = lVar11 * *(int *)((long)GA[1000].nblock + lVar20 * 4 + local_200);
          lVar20 = lVar20 + 1;
        } while (lVar22 != lVar20);
      }
      if ((-1 < local_208) && (local_208 < lVar11)) {
        if (0 < lVar22) {
          pCVar2 = GA[lVar1].mapc;
          lVar20 = 0;
          lVar15 = 0;
          lVar11 = local_208;
          do {
            lVar18 = (long)GA[lVar1].nblock[lVar15];
            lVar19 = lVar11 % lVar18;
            alStack_180[lVar15 + 1] = pCVar2[lVar19 + lVar20];
            if (lVar19 == lVar18 + -1) {
              CVar13 = GA[lVar1].dims[lVar15];
            }
            else {
              CVar13 = pCVar2[lVar19 + lVar20 + 1] + -1;
            }
            lVar20 = lVar20 + lVar18;
            local_1b8[lVar15] = CVar13;
            lVar15 = lVar15 + 1;
            lVar11 = lVar11 / lVar18;
          } while (lVar22 != lVar15);
        }
        goto LAB_0017020a;
      }
      goto LAB_001701d9;
    }
    if ((short)uVar16 < 1) goto LAB_0017020a;
    sVar9 = (ulong)uVar16 << 3;
  }
  memset(alStack_180 + 1,0,sVar9);
  memset(local_1b8,0xff,sVar9);
LAB_0017020a:
  local_1f0 = lVar22;
  if (0 < GA[lVar1].ndim) {
    lVar11 = 0;
    do {
      if ((lo[lVar11] < alStack_180[lVar11 + 1]) || (local_1b8[lVar11] < lo[lVar11])) {
        sprintf((char *)local_138,"check subscript failed:%ld not in (%ld:%ld) dim=%d");
        pnga_error((char *)local_138,lVar11);
      }
      lVar11 = lVar11 + 1;
      plVar21 = local_1d0;
    } while (lVar11 < GA[lVar1].ndim);
  }
  plVar4 = local_1d8;
  pgVar3 = GA;
  if (lVar22 == 1) {
    *plVar21 = (local_1b8[0] - alStack_180[1]) + GA[lVar1].width[0] * 2 + 1;
  }
  if (local_1f0 < 2) {
    lVar11 = 1;
    lVar20 = 0;
  }
  else {
    lVar11 = 1;
    lVar20 = 0;
    lVar15 = 0;
    do {
      lVar19 = *(long *)((long)pgVar3[1000].width + lVar15 * 8 + local_200);
      lVar20 = lVar20 + ((lVar19 + lo[lVar15]) - alStack_180[lVar15 + 1]) * lVar11;
      lVar19 = ((lVar19 * 2 + 1) - alStack_180[lVar15 + 1]) + local_1b8[lVar15];
      plVar21[lVar15] = lVar19;
      lVar11 = lVar11 * lVar19;
      lVar15 = lVar15 + 1;
    } while (lVar22 + -1 != lVar15);
  }
  if (pgVar3[lVar1].p_handle == 0) {
    CVar13 = (long)PGRP_LIST->inv_map_proc_list[local_208];
  }
  else {
    CVar13 = local_208;
    if (pgVar3[lVar1].num_rstrctd != 0) {
      CVar13 = pgVar3[lVar1].rstrctd_list[local_208];
    }
  }
  uVar12 = (ulong)pgVar3[lVar1].elemsize;
  pcVar14 = pgVar3[lVar1].ptr[CVar13] +
            (((lo[local_1f0 + -1] - alStack_180[local_1f0]) + pgVar3[lVar1].width[local_1f0 + -1]) *
             lVar11 + lVar20) * uVar12;
  IVar10 = pnga_type_c2f((long)pgVar3[lVar1].type);
  lVar22 = local_1e0;
  if (IVar10 - 0x3f2U < 6) {
    if ((0x3dU >> ((uint)(IVar10 - 0x3f2U) & 0x1f) & 1) == 0) {
      uVar17 = 0;
    }
    else {
      uVar17 = **(ulong **)(BYTE_ARRAY_001d4539 + IVar10 * 8 + 0x6f7);
      *plVar4 = (long)((long)pcVar14 - uVar17) >>
                ("(ga_sprs_array_sprsdns_multiply) matrix B must be of dimension 2"[IVar10 * 8 + 1]
                & 0x3fU);
    }
  }
  else {
    uVar17 = 0;
  }
  if ((ulong)pcVar14 % uVar12 != uVar17 % uVar12) {
    printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(ulong)(uint)GAme,pcVar14,(ulong)pcVar14 % uVar12,
           uVar17,uVar17 % uVar12);
    pnga_error("nga_access: MA addressing problem: base address misallignment",lVar22);
  }
  *plVar4 = *plVar4 + 1;
  return;
}

Assistant:

void pnga_access_idx(Integer g_a, Integer lo[], Integer hi[],
                     AccessIndex* index, Integer ld[])
{
char     *ptr;
Integer  handle = GA_OFFSET + g_a;
Integer  ow,i,p_handle;
unsigned long    elemsize;
unsigned long    lref=0, lptr;

   
   p_handle = GA[handle].p_handle;
   if(!pnga_locate(g_a,lo,&ow))pnga_error("locate top failed",0);
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].inv_map_proc_list[ow];
   if ((armci_domain_id(ARMCI_DOMAIN_SMP, ow) != armci_domain_my_id(ARMCI_DOMAIN_SMP)) && (ow != GAme)) 
      pnga_error("cannot access top of the patch",ow);
   if(!pnga_locate(g_a,hi, &ow))pnga_error("locate bottom failed",0);
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].inv_map_proc_list[ow];
   if ((armci_domain_id(ARMCI_DOMAIN_SMP, ow) != armci_domain_my_id(ARMCI_DOMAIN_SMP)) && (ow != GAme)) 
      pnga_error("cannot access bottom of the patch",ow);

   for (i=0; i<GA[handle].ndim; i++)
       if(lo[i]>hi[i]) {
           ga_RegionError(GA[handle].ndim, lo, hi, g_a);
       }

   
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].map_proc_list[ow];

   gam_Location(ow,handle, lo, &ptr, ld);

   /*
    * return patch address as the distance elements from the reference address
    *
    * .in Fortran we need only the index to the type array: dbl_mb or int_mb
    *  that are elements of COMMON in the the mafdecls.h include file
    * .in C we need both the index and the pointer
    */

   elemsize = (unsigned long)GA[handle].elemsize;

   /* compute index and check if it is correct */
   switch (pnga_type_c2f(GA[handle].type)){
     case MT_F_DBL:
        *index = (AccessIndex) ((DoublePrecision*)ptr - DBL_MB);
        lref = (unsigned long)DBL_MB;
        break;

     case MT_F_DCPL:
        *index = (AccessIndex) ((DoubleComplex*)ptr - DCPL_MB);
        lref = (unsigned long)DCPL_MB;
        break;

     case MT_F_SCPL:
        *index = (AccessIndex) ((SingleComplex*)ptr - SCPL_MB);
        lref = (unsigned long)SCPL_MB;
        break;

     case MT_F_INT:
        *index = (AccessIndex) ((Integer*)ptr - INT_MB);
        lref = (unsigned long)INT_MB;
        break;

     case MT_F_REAL:
        *index = (AccessIndex) ((float*)ptr - FLT_MB);
        lref = (unsigned long)FLT_MB;
        break;        
   }

   /* check the allignment */
   lptr = (unsigned long)ptr;
   if( lptr%elemsize != lref%elemsize ){ 
       printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(int)GAme,lptr,lptr%elemsize,
                                                    lref,lref%elemsize);
       pnga_error("nga_access: MA addressing problem: base address misallignment",
                 handle);
   }

   /* adjust index for Fortran addressing */
   (*index) ++ ;
   FLUSH_CACHE;

}